

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

GLint glcts::findMSBI(GLint input)

{
  GLuint result;
  int iVar1;
  
  iVar1 = -1;
  if (1 < input + 1U) {
    iVar1 = 0x1f;
    if (input < 1) {
      if (input < 0) {
        do {
          input = input * 2;
          iVar1 = iVar1 + -1;
        } while (input < 0);
      }
    }
    else {
      do {
        input = input * 2;
        iVar1 = iVar1 + -1;
      } while (-1 < input);
    }
  }
  return iVar1;
}

Assistant:

static GLint findMSBI(GLint input)
{
	if (input == 0 || input == -1)
	{
		return -1;
	}
	else if (input > 0)
	{
		for (GLuint result = 31;; --result)
		{
			if (input & 0x80000000)
			{
				return result;
			}
			input <<= 1;
		}
	}
	else
	{
		for (GLuint result = 31;; --result)
		{
			if (!(input & 0x80000000))
			{
				return result;
			}
			input <<= 1;
		}
	}
}